

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
llvm::SmallVectorImpl<char>::insert<char*,void>
          (SmallVectorImpl<char> *this,iterator I,char *From,char *To)

{
  move_iterator<char_*> in_end;
  ulong uVar1;
  iterator pcVar2;
  ulong uVar3;
  ulong uVar4;
  iterator __src;
  ulong __n;
  size_t __n_00;
  
  pcVar2 = (iterator)
           (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar4 = (long)I - (long)pcVar2;
  uVar1 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  if (pcVar2 + uVar1 == I) {
    append<char*,void>(this,From,To);
    __src = (iterator)
            (uVar4 + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
    ;
  }
  else {
    if (I < pcVar2) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<char>::insert(iterator, ItTy, ItTy) [T = char, ItTy = char *]"
                   );
    }
    if (pcVar2 + uVar1 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<char>::insert(iterator, ItTy, ItTy) [T = char, ItTy = char *]"
                   );
    }
    uVar3 = (long)To - (long)From;
    if ((ulong)(this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity <
        uVar3 + uVar1) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,uVar3 + uVar1,1);
      pcVar2 = (iterator)
               (this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      uVar1 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    }
    __src = pcVar2 + uVar4;
    in_end._M_current = pcVar2 + uVar1;
    __n = uVar1 - uVar4;
    if (__n < uVar3) {
      uVar3 = uVar3 + uVar1;
      if ((this->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar3) {
        __assert_fail("Size <= capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
      }
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = (uint)uVar3;
      if (uVar1 != uVar4) {
        memcpy(pcVar2 + (uVar3 - __n),__src,__n);
      }
      if (__n != 0) {
        uVar1 = 0;
        do {
          __src[uVar1] = From[uVar1];
          uVar1 = uVar1 + 1;
        } while (__n != uVar1);
        From = From + uVar1;
      }
      if (From != To) {
        memcpy(in_end._M_current,From,(long)To - (long)From);
      }
    }
    else {
      append<std::move_iterator<char*>,void>
                (this,(move_iterator<char_*>)(in_end._M_current + -uVar3),in_end);
      __n_00 = (long)(in_end._M_current + -uVar3) - (long)__src;
      if (__n_00 != 0) {
        memmove(in_end._M_current + -__n_00,__src,__n_00);
      }
      if (To != From) {
        pcVar2 = (iterator)memmove(__src,From,uVar3);
        return pcVar2;
      }
    }
  }
  return __src;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }